

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O1

bool __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::execute_task(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
               *this)

{
  recursive_mutex *__mutex;
  int iVar1;
  bool bVar2;
  function0<void> *f;
  scoped_lock lock;
  function0<void> task;
  unique_lock<boost::recursive_mutex> local_50;
  function0<void> local_40;
  
  local_40.super_function_base.vtable = (vtable_base *)0x0;
  local_50.m = &this->m_monitor;
  local_50.is_locked = false;
  unique_lock<boost::recursive_mutex>::lock(&local_50);
  if (this->m_target_worker_count < this->m_worker_count) {
LAB_0012ec03:
    bVar2 = false;
  }
  else {
    f = (this->m_scheduler).m_container.
        super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
    if ((this->m_scheduler).m_container.
        super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == f) {
      do {
        if (this->m_target_worker_count < this->m_worker_count) goto LAB_0012ec03;
        this->m_active_worker_count = this->m_active_worker_count - 1;
        condition_variable_any::notify_all(&this->m_worker_idle_or_terminated_event);
        condition_variable_any::wait<boost::unique_lock<boost::recursive_mutex>>
                  (&this->m_task_or_terminate_workers_event,&local_50);
        this->m_active_worker_count = this->m_active_worker_count + 1;
        f = (this->m_scheduler).m_container.
            super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
      } while ((this->m_scheduler).m_container.
               super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur == f);
    }
    function0<void>::operator=(&local_40,f);
    std::deque<boost::function0<void>,_std::allocator<boost::function0<void>_>_>::pop_front
              (&(this->m_scheduler).m_container);
    bVar2 = true;
  }
  __mutex = local_50.m;
  if (local_50.is_locked == true) {
    do {
      iVar1 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    } while (iVar1 == 4);
  }
  if ((local_40.super_function_base.vtable != (vtable_base *)0x0 & bVar2) == 1) {
    function0<void>::operator()(&local_40);
  }
  function0<void>::~function0(&local_40);
  return bVar2;
}

Assistant:

bool execute_task() volatile
    {
      function0<void> task;

      { // fetch task
        pool_type* lockedThis = const_cast<pool_type*>(this);
        recursive_mutex::scoped_lock lock(lockedThis->m_monitor);

        // decrease number of threads if necessary
        if(m_worker_count > m_target_worker_count)
        {	
          return false;	// terminate worker
        }


        // wait for tasks
        while(lockedThis->m_scheduler.empty())
        {	
          // decrease number of workers if necessary
          if(m_worker_count > m_target_worker_count)
          {	
            return false;	// terminate worker
          }
          else
          {
            m_active_worker_count--;
            lockedThis->m_worker_idle_or_terminated_event.notify_all();	
            lockedThis->m_task_or_terminate_workers_event.wait(lock);
            m_active_worker_count++;
          }
        }

        task = lockedThis->m_scheduler.top();
        lockedThis->m_scheduler.pop();
      }

      // call task function
      if(task)
      {
        task();
      }
 
      //guard->disable();
      return true;
    }